

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallTargetGenerator::GenerateScriptForConfigObjectLibrary
          (cmInstallTargetGenerator *this,ostream *os,string *config,Indent indent)

{
  string local_b8;
  string literal_args;
  string obj_dir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  objects;
  string dest;
  
  objects.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  objects.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  objects.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmGeneratorTarget::GetTargetObjectNames(this->Target,config,&objects);
  GetDestination(&literal_args,this,config);
  std::operator+(&obj_dir,&literal_args,"/");
  computeInstallObjectDir(&local_b8,this->Target,config);
  std::operator+(&dest,&obj_dir,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&obj_dir);
  std::__cxx11::string::~string((string *)&literal_args);
  cmGeneratorTarget::GetObjectDirectory(&obj_dir,this->Target,config);
  std::operator+(&local_b8," FILES_FROM_DIR \"",&obj_dir);
  std::operator+(&literal_args,&local_b8,"\"");
  std::__cxx11::string::~string((string *)&local_b8);
  cmInstallGenerator::AddInstallRule
            (&this->super_cmInstallGenerator,os,&dest,cmInstallType_FILES,&objects,this->Optional,
             (this->FilePermissions)._M_dataplus._M_p,(char *)0x0,(char *)0x0,
             literal_args._M_dataplus._M_p,indent);
  std::__cxx11::string::~string((string *)&literal_args);
  std::__cxx11::string::~string((string *)&obj_dir);
  std::__cxx11::string::~string((string *)&dest);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&objects);
  return;
}

Assistant:

void cmInstallTargetGenerator::GenerateScriptForConfigObjectLibrary(
  std::ostream& os, const std::string& config, Indent indent)
{
  // Compute all the object files inside this target
  std::vector<std::string> objects;
  this->Target->GetTargetObjectNames(config, objects);

  std::string const dest = this->GetDestination(config) + "/" +
    computeInstallObjectDir(this->Target, config);

  std::string const obj_dir = this->Target->GetObjectDirectory(config);
  std::string const literal_args = " FILES_FROM_DIR \"" + obj_dir + "\"";

  const char* no_dir_permissions = nullptr;
  const char* no_rename = nullptr;
  this->AddInstallRule(os, dest, cmInstallType_FILES, objects, this->Optional,
                       this->FilePermissions.c_str(), no_dir_permissions,
                       no_rename, literal_args.c_str(), indent);
}